

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qfiledialog.h
# Opt level: O0

void __thiscall Ui_QFileDialog::setupUi(Ui_QFileDialog *this,QDialog *QFileDialog)

{
  QAnyStringView *pQVar1;
  bool bVar2;
  QWidget *parent;
  QWidget *parent_00;
  QSplitter *this_00;
  QGridLayout *this_01;
  QGridLayout *this_02;
  QWidget *parent_01;
  void *pvVar3;
  QDialog *QFileDialog_00;
  QWidget *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QSizePolicy sizePolicy5;
  QSizePolicy sizePolicy4;
  QSizePolicy sizePolicy3;
  QSizePolicy sizePolicy2;
  QSizePolicy sizePolicy1;
  QSizePolicy sizePolicy;
  int iVar4;
  undefined4 uVar5;
  Orientation in_stack_fffffffffffff63c;
  enum_type in_stack_fffffffffffff640;
  ControlType in_stack_fffffffffffff644;
  char *in_stack_fffffffffffff648;
  QWidget *in_stack_fffffffffffff650;
  QWidget *this_03;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  QWidget *second;
  undefined8 in_stack_fffffffffffff668;
  undefined1 enabled;
  QWidget *first;
  QDialog *in_stack_fffffffffffff670;
  QWidget *widget;
  QAnyStringView *pQVar6;
  undefined8 uVar7;
  QLayout *layout;
  QFlagsStorage<Qt::AlignmentFlag> QVar8;
  QStackedWidget *this_04;
  Ui_QFileDialog *this_05;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_2a8;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_2a4 [5];
  undefined4 local_290;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_28c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_288;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_284 [5];
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_258;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_254;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_250;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_24c [5];
  undefined4 local_238;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_22c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_228;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_224 [5];
  undefined4 local_210;
  int local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_194;
  undefined4 local_15c;
  undefined1 local_158 [24];
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_140;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_13c [5];
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_10c;
  undefined4 local_f4;
  undefined4 local_dc;
  undefined4 local_c4;
  undefined4 local_ac;
  undefined4 local_98;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_8c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_88;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_84 [5];
  undefined1 local_70 [20];
  int local_5c;
  undefined1 local_58 [80];
  long local_8;
  
  enabled = (undefined1)((ulong)in_stack_fffffffffffff668 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::objectName();
  bVar2 = QString::isEmpty((QString *)0x76918e);
  QString::~QString((QString *)0x7691a2);
  if (bVar2) {
    std::data<char_const,12ul>((char (*) [12])"QFileDialog");
    QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x769213);
    QAnyStringView::QAnyStringView<char,_true>
              ((QAnyStringView *)in_stack_fffffffffffff650,in_stack_fffffffffffff648,
               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    QObject::setObjectName((QAnyStringView *)in_RSI);
  }
  QWidget::resize(in_stack_fffffffffffff650,(int)((ulong)in_stack_fffffffffffff648 >> 0x20),
                  (int)in_stack_fffffffffffff648);
  QDialog::setSizeGripEnabled(in_stack_fffffffffffff670,(bool)enabled);
  parent = (QWidget *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)in_stack_fffffffffffff650,parent);
  *in_RDI = parent;
  second = (QWidget *)*in_RDI;
  this_03 = (QWidget *)(local_58 + 0x18);
  parent_00 = (QWidget *)std::data<char_const,11ul>((char (*) [11])"gridLayout");
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x769302);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName((QAnyStringView *)second);
  this_00 = (QSplitter *)operator_new(0x28);
  local_58._20_4_ = 0;
  first = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76936a);
  QLabel::QLabel((QLabel *)this_03,parent,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[1] = this_00;
  pQVar6 = (QAnyStringView *)in_RDI[1];
  widget = (QWidget *)local_58;
  this_01 = (QGridLayout *)std::data<char_const,12ul>((char (*) [12])"lookInLabel");
  QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x7693e5);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  uVar7 = *in_RDI;
  layout = (QLayout *)in_RDI[1];
  local_5c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769442);
  iVar4 = local_5c;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)pQVar6 >> 0x20,0));
  this_02 = (QGridLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout
            ((QHBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  in_RDI[2] = this_02;
  this_04 = (QStackedWidget *)in_RDI[2];
  QVar8.i = (Int)((ulong)local_70 >> 0x20);
  parent_01 = (QWidget *)std::data<char_const,11ul>((char (*) [11])"hboxLayout");
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x7694f5);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName((QAnyStringView *)this_04);
  pvVar3 = operator_new(0x50);
  QFileDialogComboBox::QFileDialogComboBox
            ((QFileDialogComboBox *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4));
  in_RDI[3] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[3];
  std::data<char_const,12ul>((char (*) [12])"lookInCombo");
  QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x7695b7);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_84[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  QSizePolicy::setHorizontalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,iVar4),(int)((ulong)parent >> 0x20));
  QSizePolicy::setVerticalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,iVar4),(int)((ulong)parent >> 0x20));
  local_88.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_88.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_84[0].bits,bVar2);
  local_8c = local_84[0];
  QWidget::setSizePolicy(this_03,(QSizePolicy)SUB84((ulong)parent_00 >> 0x20,0));
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               in_stack_fffffffffffff63c,iVar4);
  QWidget::setMinimumSize(this_03,(QSize *)parent);
  local_98 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769724);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[4] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[4];
  std::data<char_const,11ul>((char (*) [11])"backButton");
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x7697dd);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_ac = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76984a);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[5] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[5];
  std::data<char_const,14ul>((char (*) [14])"forwardButton");
  QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x769903);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_c4 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769970);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[6] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[6];
  std::data<char_const,15ul>((char (*) [15])"toParentButton");
  QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])0x769a29);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_dc = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769a96);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[7] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[7];
  std::data<char_const,16ul>((char (*) [16])"newFolderButton");
  QtPrivate::lengthHelperContainer<char,16ul>((char (*) [16])0x769b4f);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_f4 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769bbc);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[8] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[8];
  std::data<char_const,15ul>((char (*) [15])"listModeButton");
  QtPrivate::lengthHelperContainer<char,15ul>((char (*) [15])0x769c75);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_10c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769ce2);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  pvVar3 = operator_new(0x28);
  QToolButton::QToolButton((QToolButton *)this_03,parent);
  in_RDI[9] = pvVar3;
  pQVar1 = (QAnyStringView *)in_RDI[9];
  std::data<char_const,17ul>((char (*) [17])"detailModeButton");
  QtPrivate::lengthHelperContainer<char,17ul>((char (*) [17])0x769d9b);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar1);
  local_124 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769e08);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,iVar4),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  local_128 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x769e62);
  uVar5 = local_128;
  QGridLayout::addLayout
            (this_02,layout,(int)((ulong)uVar7 >> 0x20),(int)uVar7,(int)((ulong)pQVar6 >> 0x20),
             (int)pQVar6,(Alignment)QVar8.i);
  QVar8.i = (Int)((ulong)pQVar6 >> 0x20);
  pvVar3 = operator_new(0x28);
  QSplitter::QSplitter
            ((QSplitter *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[10] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[10];
  std::data<char_const,9ul>((char (*) [9])0xb1dd55);
  QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x769f39);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_13c[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  QSizePolicy::setHorizontalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  QSizePolicy::setVerticalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  local_140.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_140.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_13c[0].bits,bVar2);
  local_158._20_4_ = local_13c[0];
  QWidget::setSizePolicy(this_03,(QSizePolicy)SUB84((ulong)parent_00 >> 0x20,0));
  QSplitter::setOrientation(this_00,(Orientation)((ulong)first >> 0x20));
  QSplitter::setChildrenCollapsible
            ((QSplitter *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             SUB41(in_stack_fffffffffffff63c >> 0x18,0));
  QFileDialog_00 = (QDialog *)operator_new(0x30);
  QSidebar::QSidebar((QSidebar *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                     (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0xb] = QFileDialog_00;
  pQVar6 = (QAnyStringView *)in_RDI[0xb];
  this_05 = (Ui_QFileDialog *)local_158;
  std::data<char_const,8ul>((char (*) [8])"sidebar");
  QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])0x76a0f5);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QSplitter::addWidget((QSplitter *)this_03,parent);
  pvVar3 = operator_new(0x28);
  local_15c = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76a183);
  QFrame::QFrame((QFrame *)this_03,parent,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[0xc] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0xc];
  std::data<char_const,6ul>((char (*) [6])0xab17df);
  QtPrivate::lengthHelperContainer<char,6ul>((char (*) [6])0x76a210);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QFrame::setFrameShape((QFrame *)this_03,(Shape)((ulong)parent >> 0x20));
  QFrame::setFrameShadow((QFrame *)this_03,(Shadow)((ulong)parent >> 0x20));
  pvVar3 = operator_new(0x20);
  QVBoxLayout::QVBoxLayout
            ((QVBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0xd] = pvVar3;
  (**(code **)(*(long *)in_RDI[0xd] + 0x68))((long *)in_RDI[0xd],0);
  pQVar6 = (QAnyStringView *)in_RDI[0xd];
  std::data<char_const,11ul>((char (*) [11])"vboxLayout");
  QtPrivate::lengthHelperContainer<char,11ul>((char (*) [11])0x76a329);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QLayout::setContentsMargins
            ((QLayout *)this_03,(int)((ulong)parent >> 0x20),(int)parent,in_stack_fffffffffffff644,
             in_stack_fffffffffffff640);
  pvVar3 = operator_new(0x28);
  QStackedWidget::QStackedWidget(this_04,parent_01);
  in_RDI[0xe] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0xe];
  std::data<char_const,14ul>((char (*) [14])"stackedWidget");
  QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x76a41a);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  pvVar3 = operator_new(0x28);
  local_194 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76a47c);
  QWidget::QWidget(this_03,parent,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[0xf] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0xf];
  std::data<char_const,5ul>((char (*) [5])0xb337f7);
  QtPrivate::lengthHelperContainer<char,5ul>((char (*) [5])0x76a512);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  pvVar3 = operator_new(0x20);
  QVBoxLayout::QVBoxLayout
            ((QVBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x10] = pvVar3;
  (**(code **)(*(long *)in_RDI[0x10] + 0x68))((long *)in_RDI[0x10],0);
  pQVar6 = (QAnyStringView *)in_RDI[0x10];
  std::data<char_const,12ul>((char (*) [12])"vboxLayout1");
  QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x76a606);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QLayout::setContentsMargins
            ((QLayout *)this_03,(int)((ulong)parent >> 0x20),(int)parent,in_stack_fffffffffffff644,
             in_stack_fffffffffffff640);
  pvVar3 = operator_new(0x30);
  QFileDialogListView::QFileDialogListView
            ((QFileDialogListView *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x11] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x11];
  std::data<char_const,9ul>((char (*) [9])"listView");
  QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x76a700);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_1cc = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76a773);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  QStackedWidget::addWidget
            ((QStackedWidget *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  pvVar3 = operator_new(0x28);
  local_1d0 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76a7d8);
  QWidget::QWidget(this_03,parent,
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[0x12] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x12];
  std::data<char_const,7ul>((char (*) [7])"page_2");
  QtPrivate::lengthHelperContainer<char,7ul>((char (*) [7])0x76a86b);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  pvVar3 = operator_new(0x20);
  QVBoxLayout::QVBoxLayout
            ((QVBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x13] = pvVar3;
  (**(code **)(*(long *)in_RDI[0x13] + 0x68))((long *)in_RDI[0x13],0);
  pQVar6 = (QAnyStringView *)in_RDI[0x13];
  std::data<char_const,12ul>((char (*) [12])"vboxLayout2");
  QtPrivate::lengthHelperContainer<char,12ul>((char (*) [12])0x76a962);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QLayout::setContentsMargins
            ((QLayout *)this_03,(int)((ulong)parent >> 0x20),(int)parent,in_stack_fffffffffffff644,
             in_stack_fffffffffffff640);
  pvVar3 = operator_new(0x30);
  QFileDialogTreeView::QFileDialogTreeView
            ((QFileDialogTreeView *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x14] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x14];
  std::data<char_const,9ul>((char (*) [9])"treeView");
  QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])0x76aa5f);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_204 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76aad2);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  QStackedWidget::addWidget
            ((QStackedWidget *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  local_208 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76ab45);
  QBoxLayout::addWidget
            ((QBoxLayout *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5),0,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)parent >> 0x20,0));
  QSplitter::addWidget((QSplitter *)this_03,parent);
  local_20c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76abb4);
  iVar4 = local_20c;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  pvVar3 = operator_new(0x28);
  local_210 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76ac32);
  QLabel::QLabel((QLabel *)this_03,parent,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[0x15] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x15];
  std::data<char_const,14ul>((char (*) [14])"fileNameLabel");
  QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x76acc5);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_224[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  QSizePolicy::setHorizontalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,iVar4),(int)((ulong)parent >> 0x20));
  QSizePolicy::setVerticalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,iVar4),(int)((ulong)parent >> 0x20));
  local_228.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_228.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_224[0].bits,bVar2);
  local_22c = local_224[0];
  QWidget::setSizePolicy(this_03,(QSizePolicy)SUB84((ulong)parent_00 >> 0x20,0));
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               in_stack_fffffffffffff63c,iVar4);
  QWidget::setMinimumSize(this_03,(QSize *)parent);
  local_238 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76ae3c);
  uVar5 = local_238;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  pvVar3 = operator_new(0x38);
  QFileDialogLineEdit::QFileDialogLineEdit
            ((QFileDialogLineEdit *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x16] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x16];
  std::data<char_const,13ul>((char (*) [13])"fileNameEdit");
  QtPrivate::lengthHelperContainer<char,13ul>((char (*) [13])0x76af11);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_24c[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  QSizePolicy::setHorizontalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  QSizePolicy::setVerticalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  local_250.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_250.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_24c[0].bits,bVar2);
  local_254 = local_24c[0];
  QWidget::setSizePolicy(this_03,(QSizePolicy)SUB84((ulong)parent_00 >> 0x20,0));
  local_258 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76b03e);
  uVar5 = local_258;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  pvVar3 = operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox
            ((QDialogButtonBox *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QWidget *)CONCAT44(in_stack_fffffffffffff63c,uVar5));
  in_RDI[0x17] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x17];
  std::data<char_const,10ul>((char (*) [10])"buttonBox");
  QtPrivate::lengthHelperContainer<char,10ul>((char (*) [10])0x76b110);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  QDialogButtonBox::setOrientation
            ((QDialogButtonBox *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             in_stack_fffffffffffff63c);
  ::operator|(in_stack_fffffffffffff644,in_stack_fffffffffffff640);
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             (QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>)
             SUB84((ulong)parent >> 0x20,0));
  local_26c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76b1db);
  uVar5 = local_26c;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  pvVar3 = operator_new(0x28);
  local_270 = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x76b24f);
  QLabel::QLabel((QLabel *)this_03,parent,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent_00 >> 0x20,0));
  in_RDI[0x18] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x18];
  std::data<char_const,14ul>((char (*) [14])"fileTypeLabel");
  QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x76b2e2);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_284[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  QSizePolicy::setHorizontalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  QSizePolicy::setVerticalStretch
            ((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),(int)((ulong)parent >> 0x20));
  local_288.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_288.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_284[0].bits,bVar2);
  local_28c = local_284[0];
  QWidget::setSizePolicy(this_03,(QSizePolicy)SUB84((ulong)parent_00 >> 0x20,0));
  local_290 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76b40f);
  uVar5 = local_290;
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  pvVar3 = operator_new(0x28);
  QComboBox::QComboBox((QComboBox *)second,parent_00);
  policy.data = (quint32)((ulong)parent_00 >> 0x20);
  in_RDI[0x19] = pvVar3;
  pQVar6 = (QAnyStringView *)in_RDI[0x19];
  std::data<char_const,14ul>((char (*) [14])"fileTypeCombo");
  QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x76b4e7);
  QAnyStringView::QAnyStringView<char,_true>
            ((QAnyStringView *)this_03,(char *)parent,
             CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  QObject::setObjectName(pQVar6);
  local_2a4[0].data = 0xaaaaaaaa;
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this_03,(Policy)((ulong)parent >> 0x20),(Policy)parent,
             in_stack_fffffffffffff644);
  iVar4 = (int)((ulong)parent >> 0x20);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),iVar4);
  QSizePolicy::setVerticalStretch((QSizePolicy *)CONCAT44(in_stack_fffffffffffff63c,uVar5),iVar4);
  local_2a8.bits =
       (Bits)QWidget::sizePolicy((QWidget *)
                                 CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_2a8.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_2a4[0].bits,bVar2);
  QWidget::setSizePolicy(this_03,(QSizePolicy)policy);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x76b614);
  QGridLayout::addWidget
            (this_01,widget,(int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)first >> 0x20),
             (int)first,(Alignment)QVar8.i);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  QWidget::setTabOrder(first,second);
  retranslateUi(this_05,QFileDialog_00);
  QStackedWidget::setCurrentIndex
            ((QStackedWidget *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
             in_stack_fffffffffffff63c);
  QMetaObject::connectSlotsByName(&in_RSI->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void setupUi(QDialog *QFileDialog)
    {
        if (QFileDialog->objectName().isEmpty())
            QFileDialog->setObjectName("QFileDialog");
        QFileDialog->resize(521, 316);
        QFileDialog->setSizeGripEnabled(true);
        gridLayout = new QGridLayout(QFileDialog);
        gridLayout->setObjectName("gridLayout");
        lookInLabel = new QLabel(QFileDialog);
        lookInLabel->setObjectName("lookInLabel");

        gridLayout->addWidget(lookInLabel, 0, 0, 1, 1);

        hboxLayout = new QHBoxLayout();
        hboxLayout->setObjectName("hboxLayout");
        lookInCombo = new QFileDialogComboBox(QFileDialog);
        lookInCombo->setObjectName("lookInCombo");
        QSizePolicy sizePolicy(QSizePolicy::Policy::Ignored, QSizePolicy::Policy::Fixed);
        sizePolicy.setHorizontalStretch(1);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(lookInCombo->sizePolicy().hasHeightForWidth());
        lookInCombo->setSizePolicy(sizePolicy);
        lookInCombo->setMinimumSize(QSize(50, 0));

        hboxLayout->addWidget(lookInCombo);

        backButton = new QToolButton(QFileDialog);
        backButton->setObjectName("backButton");

        hboxLayout->addWidget(backButton);

        forwardButton = new QToolButton(QFileDialog);
        forwardButton->setObjectName("forwardButton");

        hboxLayout->addWidget(forwardButton);

        toParentButton = new QToolButton(QFileDialog);
        toParentButton->setObjectName("toParentButton");

        hboxLayout->addWidget(toParentButton);

        newFolderButton = new QToolButton(QFileDialog);
        newFolderButton->setObjectName("newFolderButton");

        hboxLayout->addWidget(newFolderButton);

        listModeButton = new QToolButton(QFileDialog);
        listModeButton->setObjectName("listModeButton");

        hboxLayout->addWidget(listModeButton);

        detailModeButton = new QToolButton(QFileDialog);
        detailModeButton->setObjectName("detailModeButton");

        hboxLayout->addWidget(detailModeButton);


        gridLayout->addLayout(hboxLayout, 0, 1, 1, 2);

        splitter = new QSplitter(QFileDialog);
        splitter->setObjectName("splitter");
        QSizePolicy sizePolicy1(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Expanding);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(splitter->sizePolicy().hasHeightForWidth());
        splitter->setSizePolicy(sizePolicy1);
        splitter->setOrientation(Qt::Horizontal);
        splitter->setChildrenCollapsible(false);
        sidebar = new QSidebar(splitter);
        sidebar->setObjectName("sidebar");
        splitter->addWidget(sidebar);
        frame = new QFrame(splitter);
        frame->setObjectName("frame");
        frame->setFrameShape(QFrame::NoFrame);
        frame->setFrameShadow(QFrame::Raised);
        vboxLayout = new QVBoxLayout(frame);
        vboxLayout->setSpacing(0);
        vboxLayout->setObjectName("vboxLayout");
        vboxLayout->setContentsMargins(0, 0, 0, 0);
        stackedWidget = new QStackedWidget(frame);
        stackedWidget->setObjectName("stackedWidget");
        page = new QWidget();
        page->setObjectName("page");
        vboxLayout1 = new QVBoxLayout(page);
        vboxLayout1->setSpacing(0);
        vboxLayout1->setObjectName("vboxLayout1");
        vboxLayout1->setContentsMargins(0, 0, 0, 0);
        listView = new QFileDialogListView(page);
        listView->setObjectName("listView");

        vboxLayout1->addWidget(listView);

        stackedWidget->addWidget(page);
        page_2 = new QWidget();
        page_2->setObjectName("page_2");
        vboxLayout2 = new QVBoxLayout(page_2);
        vboxLayout2->setSpacing(0);
        vboxLayout2->setObjectName("vboxLayout2");
        vboxLayout2->setContentsMargins(0, 0, 0, 0);
        treeView = new QFileDialogTreeView(page_2);
        treeView->setObjectName("treeView");

        vboxLayout2->addWidget(treeView);

        stackedWidget->addWidget(page_2);

        vboxLayout->addWidget(stackedWidget);

        splitter->addWidget(frame);

        gridLayout->addWidget(splitter, 1, 0, 1, 3);

        fileNameLabel = new QLabel(QFileDialog);
        fileNameLabel->setObjectName("fileNameLabel");
        QSizePolicy sizePolicy2(QSizePolicy::Policy::Minimum, QSizePolicy::Policy::Preferred);
        sizePolicy2.setHorizontalStretch(0);
        sizePolicy2.setVerticalStretch(0);
        sizePolicy2.setHeightForWidth(fileNameLabel->sizePolicy().hasHeightForWidth());
        fileNameLabel->setSizePolicy(sizePolicy2);
        fileNameLabel->setMinimumSize(QSize(0, 0));

        gridLayout->addWidget(fileNameLabel, 2, 0, 1, 1);

        fileNameEdit = new QFileDialogLineEdit(QFileDialog);
        fileNameEdit->setObjectName("fileNameEdit");
        QSizePolicy sizePolicy3(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Fixed);
        sizePolicy3.setHorizontalStretch(1);
        sizePolicy3.setVerticalStretch(0);
        sizePolicy3.setHeightForWidth(fileNameEdit->sizePolicy().hasHeightForWidth());
        fileNameEdit->setSizePolicy(sizePolicy3);

        gridLayout->addWidget(fileNameEdit, 2, 1, 1, 1);

        buttonBox = new QDialogButtonBox(QFileDialog);
        buttonBox->setObjectName("buttonBox");
        buttonBox->setOrientation(Qt::Vertical);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        gridLayout->addWidget(buttonBox, 2, 2, 2, 1);

        fileTypeLabel = new QLabel(QFileDialog);
        fileTypeLabel->setObjectName("fileTypeLabel");
        QSizePolicy sizePolicy4(QSizePolicy::Policy::Preferred, QSizePolicy::Policy::Fixed);
        sizePolicy4.setHorizontalStretch(0);
        sizePolicy4.setVerticalStretch(0);
        sizePolicy4.setHeightForWidth(fileTypeLabel->sizePolicy().hasHeightForWidth());
        fileTypeLabel->setSizePolicy(sizePolicy4);

        gridLayout->addWidget(fileTypeLabel, 3, 0, 1, 1);

        fileTypeCombo = new QComboBox(QFileDialog);
        fileTypeCombo->setObjectName("fileTypeCombo");
        QSizePolicy sizePolicy5(QSizePolicy::Policy::Expanding, QSizePolicy::Policy::Fixed);
        sizePolicy5.setHorizontalStretch(0);
        sizePolicy5.setVerticalStretch(0);
        sizePolicy5.setHeightForWidth(fileTypeCombo->sizePolicy().hasHeightForWidth());
        fileTypeCombo->setSizePolicy(sizePolicy5);

        gridLayout->addWidget(fileTypeCombo, 3, 1, 1, 1);

        QWidget::setTabOrder(lookInCombo, backButton);
        QWidget::setTabOrder(backButton, forwardButton);
        QWidget::setTabOrder(forwardButton, toParentButton);
        QWidget::setTabOrder(toParentButton, newFolderButton);
        QWidget::setTabOrder(newFolderButton, listModeButton);
        QWidget::setTabOrder(listModeButton, detailModeButton);
        QWidget::setTabOrder(detailModeButton, sidebar);
        QWidget::setTabOrder(sidebar, treeView);
        QWidget::setTabOrder(treeView, listView);
        QWidget::setTabOrder(listView, fileNameEdit);
        QWidget::setTabOrder(fileNameEdit, buttonBox);
        QWidget::setTabOrder(buttonBox, fileTypeCombo);

        retranslateUi(QFileDialog);

        stackedWidget->setCurrentIndex(0);


        QMetaObject::connectSlotsByName(QFileDialog);
    }